

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bip324.cpp
# Opt level: O0

bool __thiscall
BIP324Cipher::Decrypt
          (BIP324Cipher *this,Span<const_std::byte> input,Span<const_std::byte> aad,bool *ignore,
          Span<std::byte> contents)

{
  Span<const_std::byte> aad_00;
  Span<const_std::byte> cipher;
  bool bVar1;
  size_t sVar2;
  size_t sVar3;
  size_t in_RDX;
  byte *in_RSI;
  undefined8 in_R9;
  long in_FS_OFFSET;
  undefined1 in_stack_00000010 [16];
  Span<std::byte> in_stack_00000020;
  byte header [1];
  Span<std::byte> *in_stack_ffffffffffffff28;
  undefined5 in_stack_ffffffffffffff88;
  undefined1 in_stack_ffffffffffffff8d;
  undefined1 in_stack_ffffffffffffff8e;
  undefined1 in_stack_ffffffffffffff8f;
  undefined7 in_stack_fffffffffffffff0;
  byte in_stack_fffffffffffffff7;
  size_t sVar4;
  
  sVar4 = *(size_t *)(in_FS_OFFSET + 0x28);
  sVar2 = Span<const_std::byte>::size((Span<const_std::byte> *)in_stack_ffffffffffffff28);
  sVar3 = Span<std::byte>::size(in_stack_ffffffffffffff28);
  if (sVar2 + 3 != sVar3 + 0x14) {
    __assert_fail("input.size() + LENGTH_LEN == contents.size() + EXPANSION",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/bip324.cpp"
                  ,0x66,
                  "bool BIP324Cipher::Decrypt(Span<const std::byte>, Span<const std::byte>, bool &, Span<std::byte>)"
                 );
  }
  std::optional<FSChaCha20Poly1305>::operator->
            ((optional<FSChaCha20Poly1305> *)in_stack_ffffffffffffff28);
  Span<std::byte>::Span<1>(in_stack_ffffffffffffff28,(byte (*) [1])0x8b6947);
  cipher.m_data._7_1_ = in_stack_fffffffffffffff7;
  cipher.m_data._0_7_ = in_stack_fffffffffffffff0;
  cipher.m_size = sVar4;
  aad_00.m_size = in_RDX;
  aad_00.m_data = in_RSI;
  bVar1 = FSChaCha20Poly1305::Decrypt
                    ((FSChaCha20Poly1305 *)
                     CONCAT17(in_stack_ffffffffffffff8f,
                              CONCAT16(in_stack_ffffffffffffff8e,
                                       CONCAT15(in_stack_ffffffffffffff8d,in_stack_ffffffffffffff88)
                                      )),cipher,aad_00,(Span<std::byte>)in_stack_00000010,
                     in_stack_00000020);
  if (bVar1) {
    *(bool *)in_R9 = (in_stack_fffffffffffffff7 & 0x80) == 0x80;
  }
  if (*(size_t *)(in_FS_OFFSET + 0x28) != sVar4) {
    __stack_chk_fail();
  }
  return bVar1;
}

Assistant:

bool BIP324Cipher::Decrypt(Span<const std::byte> input, Span<const std::byte> aad, bool& ignore, Span<std::byte> contents) noexcept
{
    assert(input.size() + LENGTH_LEN == contents.size() + EXPANSION);

    std::byte header[HEADER_LEN];
    if (!m_recv_p_cipher->Decrypt(input, aad, header, contents)) return false;

    ignore = (header[0] & IGNORE_BIT) == IGNORE_BIT;
    return true;
}